

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O2

gdImagePtr gdImageRotate270(gdImagePtr src,int ignoretransparent)

{
  int iVar1;
  int color;
  gdImagePtr to;
  code *pcVar2;
  uint uVar3;
  int y;
  
  if (src->trueColor == 0) {
    pcVar2 = gdImageGetPixel;
  }
  else {
    pcVar2 = gdImageGetTrueColorPixel;
  }
  to = gdImageCreateTrueColor(src->sy,src->sx);
  if (to != (gdImagePtr)0x0) {
    iVar1 = to->alphaBlendingFlag;
    to->alphaBlendingFlag = 0;
    to->transparent = src->transparent;
    gdImagePaletteCopy(to,src);
    for (uVar3 = 0; (int)uVar3 < src->sy; uVar3 = uVar3 + 1) {
      for (y = 0; y < src->sx; y = y + 1) {
        color = (*pcVar2)(src,y,uVar3);
        if (src->trueColor == 0) {
          color = src->green[color] * 0x100 + src->red[color] * 0x10000 + src->blue[color] +
                  src->alpha[color] * 0x1000000;
        }
        gdImageSetPixel(to,to->sx + ~uVar3,y,color);
      }
    }
    to->alphaBlendingFlag = iVar1;
  }
  return to;
}

Assistant:

gdImagePtr gdImageRotate270 (gdImagePtr src, int ignoretransparent)
{
	int uY, uX;
	int c,r,g,b,a;
	gdImagePtr dst;
	FuncPtr f;

	if (src->trueColor) {
		f = gdImageGetTrueColorPixel;
	} else {
		f = gdImageGetPixel;
	}
	dst = gdImageCreateTrueColor (src->sy, src->sx);

	if (dst != NULL) {
		int old_blendmode = dst->alphaBlendingFlag;
		dst->alphaBlendingFlag = 0;

		dst->transparent = src->transparent;

		gdImagePaletteCopy (dst, src);

		for (uY = 0; uY<src->sy; uY++) {
			for (uX = 0; uX<src->sx; uX++) {
				c = f (src, uX, uY);
				if (!src->trueColor) {
					r = gdImageRed(src,c);
					g = gdImageGreen(src,c);
					b = gdImageBlue(src,c);
					a = gdImageAlpha(src,c);
					c = gdTrueColorAlpha(r, g, b, a);
				}

				if (ignoretransparent && c == dst->transparent) {
					gdImageSetPixel(dst, (dst->sx - uY - 1), uX, dst->transparent);
				} else {
					gdImageSetPixel(dst, (dst->sx - uY - 1), uX, c);
				}
			}
		}
		dst->alphaBlendingFlag = old_blendmode;
	}

	return dst;
}